

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O3

size_t lineage::loadEdges(string *fileName,Problem *problem)

{
  pointer *ppEVar1;
  pointer pEVar2;
  iterator __position;
  istream *piVar3;
  double *pdVar4;
  size_t sVar5;
  Edge e;
  ifstream file;
  Edge local_258;
  vector<lineage::Edge,std::allocator<lineage::Edge>> *local_240;
  istream local_238 [520];
  
  pEVar2 = (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar2;
  }
  local_240 = (vector<lineage::Edge,std::allocator<lineage::Edge>> *)&problem->edges;
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in);
  sVar5 = 0;
  while( true ) {
    piVar3 = (istream *)std::istream::operator>>(local_238,&local_258.t0);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_258.v0);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_258.t1);
    pdVar4 = (double *)std::istream::operator>>(piVar3,&local_258.v1);
    piVar3 = std::istream::_M_extract<double>(pdVar4);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    __position._M_current =
         (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<lineage::Edge,std::allocator<lineage::Edge>>::
      _M_realloc_insert<lineage::Edge_const&>(local_240,__position,&local_258);
    }
    else {
      (__position._M_current)->weight = local_258.weight;
      (__position._M_current)->t0 = local_258.t0;
      (__position._M_current)->v0 = local_258.v0;
      (__position._M_current)->t1 = local_258.t1;
      (__position._M_current)->v1 = local_258.v1;
      ppEVar1 = &(problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
    sVar5 = sVar5 + 1;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  return sVar5;
}

Assistant:

inline
size_t loadEdges(const std::string& fileName, Problem& problem)
{
    problem.edges.clear();

    std::ifstream file(fileName);

    Edge e;
    size_t counter = 0;
    while (file >> e.t0 >> e.v0 >> e.t1 >> e.v1 >> e.weight)
    {
        problem.edges.push_back(e);
        ++counter;
    }

    file.close();

    return counter;
}